

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ResolveExprNames(NameContext *pNC,Expr *pExpr)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  Walker w;
  
  if (pExpr == (Expr *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar1 = pNC->ncFlags;
    pNC->ncFlags = uVar1 & 0xefef;
    w.pParse = pNC->pParse;
    w.xExprCallback = resolveExprStep;
    w.xSelectCallback = resolveSelectStep;
    w.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
    iVar4 = (w.pParse)->nHeight + pExpr->nHeight;
    (w.pParse)->nHeight = iVar4;
    w.u.pNC = pNC;
    iVar4 = sqlite3ExprCheckHeight(w.pParse,iVar4);
    uVar3 = 1;
    if (iVar4 == 0) {
      walkExpr(&w,pExpr);
      (w.pParse)->nHeight = (w.pParse)->nHeight - pExpr->nHeight;
      uVar2 = pNC->ncFlags;
      if ((uVar2 & 0x10) != 0) {
        *(byte *)&pExpr->flags = (byte)pExpr->flags | 2;
      }
      pNC->ncFlags = uVar1 & 0x1010 | uVar2;
      if (pNC->nErr < 1) {
        uVar3 = (uint)(0 < (w.pParse)->nErr);
      }
    }
  }
  return uVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveExprNames( 
  NameContext *pNC,       /* Namespace to resolve expressions in. */
  Expr *pExpr             /* The expression to be analyzed. */
){
  u16 savedHasAgg;
  Walker w;

  if( pExpr==0 ) return SQLITE_OK;
  savedHasAgg = pNC->ncFlags & (NC_HasAgg|NC_MinMaxAgg);
  pNC->ncFlags &= ~(NC_HasAgg|NC_MinMaxAgg);
  w.pParse = pNC->pParse;
  w.xExprCallback = resolveExprStep;
  w.xSelectCallback = resolveSelectStep;
  w.xSelectCallback2 = 0;
  w.u.pNC = pNC;
#if SQLITE_MAX_EXPR_DEPTH>0
  w.pParse->nHeight += pExpr->nHeight;
  if( sqlite3ExprCheckHeight(w.pParse, w.pParse->nHeight) ){
    return SQLITE_ERROR;
  }
#endif
  sqlite3WalkExpr(&w, pExpr);
#if SQLITE_MAX_EXPR_DEPTH>0
  w.pParse->nHeight -= pExpr->nHeight;
#endif
  if( pNC->ncFlags & NC_HasAgg ){
    ExprSetProperty(pExpr, EP_Agg);
  }
  pNC->ncFlags |= savedHasAgg;
  return pNC->nErr>0 || w.pParse->nErr>0;
}